

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_prompt.hpp
# Opt level: O0

string * util::prompt(string *__return_storage_ptr__,string *__question,int __max_size)

{
  int iVar1;
  ostream *poVar2;
  bool local_61;
  int _out_length;
  allocator local_1d;
  int local_1c;
  string *psStack_18;
  int __max_size_local;
  string *__question_local;
  string *_out;
  
  local_1c = __max_size;
  psStack_18 = __question;
  __question_local = __return_storage_ptr__;
  if (__max_size < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    do {
      std::ostream::flush();
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)__question);
      std::operator<<(poVar2,"\n>>> ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)__return_storage_ptr__);
      iVar1 = std::__cxx11::string::length();
      local_61 = iVar1 < 1 || local_1c < iVar1;
    } while (local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prompt(std::string __question, int __max_size = MAX_STRING_LENGTH)
	{
		if (__max_size <= 0)
			return "";

		std::string _out;
		int _out_length;
		do {
			std::cout.flush();
			std::cout << __question << "\n>>> ";
			std::getline(std::cin, _out);
			_out_length = _out.length();
		} while (_out_length <= 0 || _out_length > __max_size);

		return _out;
	}